

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O0

void __thiscall
CircularArrayTest_clear_Test::CircularArrayTest_clear_Test(CircularArrayTest_clear_Test *this)

{
  CircularArrayTest_clear_Test *this_local;
  
  anon_unknown.dwarf_f66d::CircularArrayTest::CircularArrayTest(&this->super_CircularArrayTest);
  (this->super_CircularArrayTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CircularArrayTest_clear_Test_005c22b0;
  return;
}

Assistant:

TEST_F(CircularArrayTest, clear) {
  CircularArray<TestObject, 2> ca;

  ca.push_back(TestObject(1));
  ca.push_back(TestObject(2));
  ASSERT_EQ(2U, ca.size());

  ca.clear();
  ASSERT_EQ(0U, ca.size());
}